

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

char * filemgr_latency_stat_name(fdb_latency_stat_type stat)

{
  if (stat < 0x13) {
    return &DAT_00158768 + *(int *)(&DAT_00158768 + (ulong)stat * 4);
  }
  return (char *)0x0;
}

Assistant:

const char *filemgr_latency_stat_name(fdb_latency_stat_type stat)
{
    switch(stat) {
        case FDB_LATENCY_SETS:          return "sets            ";
        case FDB_LATENCY_GETS:          return "gets            ";
        case FDB_LATENCY_SNAP_INMEM:    return "in-mem_snapshot ";
        case FDB_LATENCY_SNAP_DUR:      return "durable_snapshot";
        case FDB_LATENCY_COMMITS:       return "commits         ";
        case FDB_LATENCY_COMPACTS:      return "compact         ";
        case FDB_LATENCY_ITR_INIT:      return "itr-init        ";
        case FDB_LATENCY_ITR_SEQ_INIT:  return "itr-seq-ini     ";
        case FDB_LATENCY_ITR_NEXT:      return "itr-next        ";
        case FDB_LATENCY_ITR_PREV:      return "itr-prev        ";
        case FDB_LATENCY_ITR_GET:       return "itr-get         ";
        case FDB_LATENCY_ITR_GET_META:  return "itr-get-meta    ";
        case FDB_LATENCY_ITR_SEEK:      return "itr-seek        ";
        case FDB_LATENCY_ITR_SEEK_MAX:  return "itr-seek-max    ";
        case FDB_LATENCY_ITR_SEEK_MIN:  return "itr-seek-min    ";
        case FDB_LATENCY_ITR_CLOSE:     return "itr-close       ";
        case FDB_LATENCY_OPEN:          return "fdb_open        ";
        case FDB_LATENCY_KVS_OPEN:      return "fdb_kvs_open    ";
        case FDB_LATENCY_SNAP_CLONE:    return "clone-snapshot  ";
    }
    return NULL;
}